

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile_impl.cc
# Opt level: O1

void __thiscall webrtc::EchoControlMobileImpl::ReadQueuedRenderData(EchoControlMobileImpl *this)

{
  StreamProperties *pSVar1;
  pointer puVar2;
  bool bVar3;
  ulong nrOfSamples;
  void *aecmInst;
  ostream *poVar4;
  long lVar5;
  unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>
  *canceller;
  pointer puVar6;
  CritScope cs_capture;
  CritScope local_1b0;
  FatalMessage local_1a8;
  
  rtc::CritScope::CritScope(&local_1b0,this->crit_capture_);
  if ((this->stream_properties_)._M_t.
      super___uniq_ptr_impl<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
      ._M_t.
      super__Tuple_impl<0UL,_webrtc::EchoControlMobileImpl::StreamProperties_*,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
      .super__Head_base<0UL,_webrtc::EchoControlMobileImpl::StreamProperties_*,_false>._M_head_impl
      == (StreamProperties *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_control_mobile_impl.cc"
               ,0xba);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Check failed: stream_properties_",0x20);
    std::ios::widen((char)(ostream *)&local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)&local_1a8);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# ",2);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  if (this->enabled_ == true) {
    while (bVar3 = SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
                   ::Remove((this->render_signal_queue_)._M_t.
                            super___uniq_ptr_impl<webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>,_std::default_delete<webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>_*,_std::default_delete<webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>_>_>
                            .
                            super__Head_base<0UL,_webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>_*,_false>
                            ._M_head_impl,&this->capture_queue_buffer_), bVar3) {
      puVar6 = (this->cancellers_).
               super__Vector_base<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar1 = (this->stream_properties_)._M_t.
               super___uniq_ptr_impl<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
               ._M_t.
               super__Tuple_impl<0UL,_webrtc::EchoControlMobileImpl::StreamProperties_*,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
               .super__Head_base<0UL,_webrtc::EchoControlMobileImpl::StreamProperties_*,_false>.
               _M_head_impl;
      nrOfSamples = (ulong)((long)(this->capture_queue_buffer_).
                                  super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(this->capture_queue_buffer_).
                                  super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 1) /
                    (pSVar1->num_reverse_channels * pSVar1->num_output_channels);
      puVar2 = (this->cancellers_).
               super__Vector_base<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar6 != puVar2) {
        lVar5 = 0;
        do {
          aecmInst = Canceller::state((puVar6->_M_t).
                                      super___uniq_ptr_impl<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_webrtc::EchoControlMobileImpl::Canceller_*,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>
                                      .
                                      super__Head_base<0UL,_webrtc::EchoControlMobileImpl::Canceller_*,_false>
                                      ._M_head_impl);
          WebRtcAecm_BufferFarend
                    (aecmInst,(this->capture_queue_buffer_).
                              super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar5,nrOfSamples);
          lVar5 = lVar5 + nrOfSamples;
          puVar6 = puVar6 + 1;
        } while (puVar6 != puVar2);
      }
    }
  }
  rtc::CritScope::~CritScope(&local_1b0);
  return;
}

Assistant:

void EchoControlMobileImpl::ReadQueuedRenderData() {
  rtc::CritScope cs_capture(crit_capture_);
  RTC_DCHECK(stream_properties_);

  if (!enabled_) {
    return;
  }

  while (render_signal_queue_->Remove(&capture_queue_buffer_)) {
    size_t buffer_index = 0;
    size_t num_frames_per_band = capture_queue_buffer_.size() /
                                 (stream_properties_->num_output_channels *
                                  stream_properties_->num_reverse_channels);

    for (auto& canceller : cancellers_) {
      WebRtcAecm_BufferFarend(canceller->state(),
                              &capture_queue_buffer_[buffer_index],
                              num_frames_per_band);

      buffer_index += num_frames_per_band;
    }
  }
}